

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

time_t __thiscall pstore::file::file_handle::latest_time(file_handle *this)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  initializer_list<long> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  __time_t local_c0;
  __time_t local_b8;
  __time_t local_b0;
  stat buf;
  
  memset(&buf,0,0x90);
  iVar1 = stat((this->path_)._M_dataplus._M_p,(stat *)&buf);
  if (iVar1 == 0) {
    local_c0 = buf.st_atim.tv_sec;
    local_b8 = buf.st_mtim.tv_sec;
    local_b0 = buf.st_ctim.tv_sec;
    __l._M_len = 3;
    __l._M_array = &local_c0;
    lVar2 = std::max<long>(__l);
    return lVar2;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  std::__cxx11::string::string((string *)&local_e0,(string *)&this->path_);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar1,"stat failed",&local_e0);
}

Assistant:

std::time_t file_handle::latest_time () const {
            struct stat buf {};
            if (::stat (path_.c_str (), &buf) != 0) {
                int const err = errno;
                raise_file_error (err, "stat failed", path_);
            }
/// The time members of struct stat might be called st_Xtimespec (of type struct timespec) or
/// st_Xtime (and be of type time_t). This macro is defined in the former situation.
#    ifdef PSTORE_STAT_TIMESPEC
            auto compare = [] (struct timespec const & lhs, struct timespec const & rhs) {
                return std::make_pair (lhs.tv_sec, lhs.tv_nsec) <
                       std::make_pair (rhs.tv_sec, rhs.tv_nsec);
            };
            auto const t =
                std::max ({buf.st_atimespec, buf.st_mtimespec, buf.st_ctimespec}, compare);
            constexpr auto nano = 1000000000;
            return t.tv_sec + (t.tv_nsec + (nano / 2)) / nano;
#    else
            return std::max ({buf.st_atime, buf.st_mtime, buf.st_ctime});
#    endif
        }